

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

void __thiscall icu_63::SpoofData::SpoofData(SpoofData *this,UDataMemory *udm,UErrorCode *status)

{
  UBool UVar1;
  SpoofDataHeader *pSVar2;
  UErrorCode *status_local;
  UDataMemory *udm_local;
  SpoofData *this_local;
  
  reset(this);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this->fUDM = udm;
    pSVar2 = (SpoofDataHeader *)udata_getMemory_63(udm);
    this->fRawData = pSVar2;
    validateDataVersion(this,status);
    initPtrs(this,status);
  }
  return;
}

Assistant:

SpoofData::SpoofData(UDataMemory *udm, UErrorCode &status)
{
    reset();
    if (U_FAILURE(status)) {
        return;
    }
    fUDM = udm;
    // fRawData is non-const because it may be constructed by the data builder.
    fRawData = reinterpret_cast<SpoofDataHeader *>(
            const_cast<void *>(udata_getMemory(udm)));
    validateDataVersion(status);
    initPtrs(status);
}